

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall
GameEngine::getPopulationPattern
          (GameEngine *this,vector<LightPopulation,_std::allocator<LightPopulation>_> *populations)

{
  bool bVar1;
  __shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *this_02;
  __shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *__args;
  shared_ptr<Population> *population;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__range2;
  shared_ptr<Player> *player;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *__range1;
  vector<LightPopulation,_std::allocator<LightPopulation>_> *populations_local;
  GameEngine *this_local;
  
  __end1 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::begin
                     (&this->players);
  player = (shared_ptr<Player> *)
           std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::end
                     (&this->players);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
                                *)&player);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
              ::operator*(&__end1);
    this_01 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        (this_00);
    this_02 = Player::GetPlayerPopulations(this_01);
    __end2 = std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
             ::begin(this_02);
    population = (shared_ptr<Population> *)
                 std::
                 vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                 ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                                  *)&population);
      if (!bVar1) break;
      this_03 = (__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                ::operator*(&__end2);
      __args = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*(this_03);
      std::vector<LightPopulation,std::allocator<LightPopulation>>::emplace_back<Population&>
                ((vector<LightPopulation,std::allocator<LightPopulation>> *)populations,__args);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void GameEngine::getPopulationPattern(std::vector<LightPopulation> &populations) {
  for (const auto &player : players) {
    for (const auto &population : player->GetPlayerPopulations()) {
      populations.emplace_back(*population);
    }
  }
}